

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

void __thiscall gl4cts::anon_unknown_0::ImageSizeMachine::~ImageSizeMachine(ImageSizeMachine *this)

{
  CallLogWrapper *this_00;
  int i;
  long lVar1;
  
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__ImageSizeMachine_01dd7ff8;
  this_00 = &(this->super_GLWrapper).super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_pipeline);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[lVar1]);
  }
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_texture);
  glu::CallLogWrapper::~CallLogWrapper(this_00);
  return;
}

Assistant:

~ImageSizeMachine()
	{
		glDeleteProgramPipelines(1, &m_pipeline);
		for (int i = 0; i < 3; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteTextures(1, &m_texture);
	}